

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O0

void Omega_h::anon_unknown_41::promote_bools(LO size,any *lhs,any *rhs)

{
  bool bVar1;
  type_info *ptVar2;
  Read<signed_char> local_90 [2];
  Read<signed_char> local_70;
  any *local_60;
  any *rhs_local;
  any *lhs_local;
  Read<signed_char> *pRStack_48;
  LO size_local;
  Read<signed_char> *local_40;
  Read<signed_char> *local_38;
  Read<signed_char> *local_30;
  Read<signed_char> *local_28;
  ulong local_20;
  Read<signed_char> *local_18;
  ulong local_10;
  
  local_60 = rhs;
  rhs_local = lhs;
  lhs_local._4_4_ = size;
  ptVar2 = any::type(lhs);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&bool::typeinfo);
  if (bVar1) {
    ptVar2 = any::type(local_60);
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Read<signed_char>::typeinfo);
    if (bVar1) {
      any_cast<Omega_h::Read<signed_char>>((Omega_h *)&local_70,local_60);
      local_40 = &local_70;
      if (((ulong)local_70.write_.shared_alloc_.alloc & 1) == 0) {
        local_10 = (local_70.write_.shared_alloc_.alloc)->size;
      }
      else {
        local_10 = (ulong)local_70.write_.shared_alloc_.alloc >> 3;
      }
      local_38 = local_40;
      local_18 = local_40;
      if ((int)local_10 != lhs_local._4_4_) {
        fail("assertion %s failed at %s +%d\n","any_cast<Bytes>(rhs).size() == size",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp"
             ,0x15);
      }
      Read<signed_char>::~Read(&local_70);
      promote_bool(lhs_local._4_4_,rhs_local);
    }
  }
  ptVar2 = any::type(rhs_local);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Read<signed_char>::typeinfo);
  if (bVar1) {
    ptVar2 = any::type(local_60);
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&bool::typeinfo);
    if (bVar1) {
      any_cast<Omega_h::Read<signed_char>>((Omega_h *)local_90,rhs_local);
      pRStack_48 = local_90;
      if (((ulong)local_90[0].write_.shared_alloc_.alloc & 1) == 0) {
        local_20 = (local_90[0].write_.shared_alloc_.alloc)->size;
      }
      else {
        local_20 = (ulong)local_90[0].write_.shared_alloc_.alloc >> 3;
      }
      local_30 = pRStack_48;
      local_28 = pRStack_48;
      if ((int)local_20 != lhs_local._4_4_) {
        fail("assertion %s failed at %s +%d\n","any_cast<Bytes>(lhs).size() == size",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp"
             ,0x19);
      }
      Read<signed_char>::~Read(local_90);
      promote_bool(lhs_local._4_4_,local_60);
    }
  }
  return;
}

Assistant:

void promote_bools(LO size, any& lhs, any& rhs) {
  if (lhs.type() == typeid(bool) && rhs.type() == typeid(Bytes)) {
    OMEGA_H_CHECK(any_cast<Bytes>(rhs).size() == size);
    promote_bool(size, lhs);
  }
  if (lhs.type() == typeid(Bytes) && rhs.type() == typeid(bool)) {
    OMEGA_H_CHECK(any_cast<Bytes>(lhs).size() == size);
    promote_bool(size, rhs);
  }
}